

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O2

void event_active_nolock_(event *ev,int res,short ncalls)

{
  ushort uVar1;
  event_base *base;
  unsigned_long uVar2;
  int iVar3;
  unsigned_long uVar4;
  event_debug_entry *peVar5;
  undefined8 uVar6;
  int blocking;
  event *peVar7;
  void *lock_;
  char *pcVar8;
  ushort uVar9;
  undefined1 auStack_48 [24];
  event *peStack_30;
  
  blocking = res;
  if (event_debug_logging_mask_ != 0) {
    peStack_30 = (event *)0x1f6cfb;
    peVar7 = ev;
    event_debugx_("event_active: %p (fd %d), res %d, callback %p",ev,(ulong)(uint)ev->ev_fd,
                  (ulong)(uint)res,(ev->ev_evcallback).evcb_cb_union.evcb_callback);
    blocking = (int)peVar7;
  }
  base = ev->ev_base;
  lock_ = base->th_base_lock;
  if ((lock_ != (void *)0x0) && (evthread_lock_debugging_enabled_ != 0)) {
    peStack_30 = (event *)0x1f6d1c;
    iVar3 = evthread_is_debug_lock_held_(lock_);
    if (iVar3 == 0) {
      pcVar8 = "evthread_is_debug_lock_held_((base)->th_base_lock)";
      uVar6 = 0xb72;
      goto LAB_001f6e12;
    }
  }
  uVar1 = (ev->ev_evcallback).evcb_flags;
  if ((uVar1 & 0x40) != 0) {
    return;
  }
  uVar9 = (ushort)res;
  switch(uVar1 >> 3 & 5) {
  case 0:
    ev->ev_res = uVar9;
    break;
  case 1:
    ev->ev_res = ev->ev_res | uVar9;
    return;
  default:
    if (event_debug_mode_on_ != 0) {
      peVar5 = (event_debug_entry *)event_debug_map_lock_;
      auStack_48._8_8_ = lock_;
      peStack_30 = ev;
      if (event_debug_map_lock_ != (void *)0x0) {
        (*evthread_lock_fns_.lock)(0,event_debug_map_lock_);
      }
      peVar5 = event_debug_map_HT_FIND((event_debug_map *)auStack_48,peVar5);
      if ((peVar5 != (event_debug_entry *)0x0) && ((peVar5->field_0x10 & 1) != 0)) {
        event_errx(-0x21522153,
                   "%s called on an already added event %p (events: 0x%x, fd: %d, flags: 0x%x)",
                   "event_debug_assert_not_added_",lock_,
                   (ulong)(uint)(int)*(short *)((long)lock_ + 0x68),
                   (ulong)*(uint *)((long)lock_ + 0x38),(int)*(short *)((long)lock_ + 0x10));
      }
      if (event_debug_map_lock_ != (void *)0x0) {
        (*evthread_lock_fns_.unlock)(0,event_debug_map_lock_);
        return;
      }
    }
    return;
  case 4:
    ev->ev_res = ev->ev_res | uVar9;
    break;
  case 5:
    pcVar8 = "0";
    uVar6 = 0xb7c;
LAB_001f6e12:
    peStack_30 = (event *)0x1f6e19;
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
               ,uVar6,pcVar8,"event_active_nolock_");
  case 6:
    event_del_nolock_(ev,blocking);
    return;
  case 7:
    return;
  }
  if ((int)(uint)(ev->ev_evcallback).evcb_pri < base->event_running_priority) {
    base->event_continue = 1;
  }
  if ((ev->ev_events & 8) != 0) {
    if (evthread_id_fn_ != (_func_unsigned_long *)0x0 && (event *)base->current_event == ev) {
      uVar2 = base->th_owner_id;
      peStack_30 = (event *)0x1f6da3;
      uVar4 = (*evthread_id_fn_)();
      if (uVar2 != uVar4) {
        base->current_event_waiters = base->current_event_waiters + 1;
        if (base->current_event_cond != (void *)0x0) {
          peStack_30 = (event *)0x1f6dce;
          (*evthread_cond_fns_.wait_condition)
                    (base->current_event_cond,base->th_base_lock,(timeval *)0x0);
        }
      }
    }
    (ev->ev_).ev_signal.ev_ncalls = ncalls;
    (ev->ev_).ev_io.ev_timeout.tv_usec = 0;
  }
  event_callback_activate_nolock_(base,&ev->ev_evcallback);
  return;
}

Assistant:

void
event_active_nolock_(struct event *ev, int res, short ncalls)
{
	struct event_base *base;

	event_debug(("event_active: %p (fd "EV_SOCK_FMT"), res %d, callback %p",
		ev, EV_SOCK_ARG(ev->ev_fd), (int)res, ev->ev_callback));

	base = ev->ev_base;
	EVENT_BASE_ASSERT_LOCKED(base);

	if (ev->ev_flags & EVLIST_FINALIZING) {
		/* XXXX debug */
		return;
	}

	switch ((ev->ev_flags & (EVLIST_ACTIVE|EVLIST_ACTIVE_LATER))) {
	default:
	case EVLIST_ACTIVE|EVLIST_ACTIVE_LATER:
		EVUTIL_ASSERT(0);
		break;
	case EVLIST_ACTIVE:
		/* We get different kinds of events, add them together */
		ev->ev_res |= res;
		return;
	case EVLIST_ACTIVE_LATER:
		ev->ev_res |= res;
		break;
	case 0:
		ev->ev_res = res;
		break;
	}

	if (ev->ev_pri < base->event_running_priority)
		base->event_continue = 1;

	if (ev->ev_events & EV_SIGNAL) {
#ifndef EVENT__DISABLE_THREAD_SUPPORT
		if (base->current_event == event_to_event_callback(ev) &&
		    !EVBASE_IN_THREAD(base)) {
			++base->current_event_waiters;
			EVTHREAD_COND_WAIT(base->current_event_cond, base->th_base_lock);
		}
#endif
		ev->ev_ncalls = ncalls;
		ev->ev_pncalls = NULL;
	}

	event_callback_activate_nolock_(base, event_to_event_callback(ev));
}